

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptorProto::SerializeWithCachedSizes
          (ServiceDescriptorProto *this,CodedOutputStream *output)

{
  uint uVar1;
  int size;
  uint uVar2;
  char *data;
  string *value;
  MethodDescriptorProto *value_00;
  UnknownFieldSet *unknown_fields;
  uint local_40;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ServiceDescriptorProto *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"google.protobuf.ServiceDescriptorProto.name");
    value = name_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(1,value,output);
  }
  local_40 = 0;
  uVar2 = method_size(this);
  for (; local_40 < uVar2; local_40 = local_40 + 1) {
    value_00 = method(this,local_40);
    internal::WireFormatLite::WriteMessageMaybeToArray(2,(MessageLite *)value_00,output);
  }
  if ((uVar1 & 2) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray(3,(MessageLite *)this->options_,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ServiceDescriptorProto::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void ServiceDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.ServiceDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.ServiceDescriptorProto.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  for (unsigned int i = 0, n = this->method_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      2, this->method(i), output);
  }

  // optional .google.protobuf.ServiceOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      3, *this->options_, output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.ServiceDescriptorProto)
}